

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O1

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_ExceptionThrow_Test::Body
          (iu_SyntaxTest_x_iutest_x_ExceptionThrow_Test *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = std::locale::locale;
  __cxa_throw(puVar1,&std::bad_exception::typeinfo,std::bad_exception::~bad_exception);
}

Assistant:

static void ExceptionFunction(int i)
{
    switch( i )
    {
    case 0:
        return;
    case 1:
        throw 2;
    case 2:
        throw ::std::bad_exception();
    case 3:
        throw "error";
    case 4:
        throw ::std::string("error");
    case 5:
        throw 0.1f;
    default:
        break;
    }
}